

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_reader.c
# Opt level: O2

void nhdp_reader_init(oonf_rfc5444_protocol *p)

{
  _protocol = p;
  rfc5444_reader_add_message_consumer(&p->reader,&_nhdp_message_pass1_consumer,_nhdp_message_tlvs,6)
  ;
  rfc5444_reader_add_message_consumer
            (&_protocol->reader,&_nhdp_address_pass1_consumer,_nhdp_address_pass1_tlvs,2);
  rfc5444_reader_add_message_consumer(&_protocol->reader,&_nhdp_message_pass2_consumer,0,0);
  rfc5444_reader_add_message_consumer
            (&_protocol->reader,&_nhdp_address_pass2_consumer,_nhdp_address_pass2_tlvs,5);
  return;
}

Assistant:

void
nhdp_reader_init(struct oonf_rfc5444_protocol *p) {
  _protocol = p;

  rfc5444_reader_add_message_consumer(
    &_protocol->reader, &_nhdp_message_pass1_consumer, _nhdp_message_tlvs, ARRAYSIZE(_nhdp_message_tlvs));
  rfc5444_reader_add_message_consumer(
    &_protocol->reader, &_nhdp_address_pass1_consumer, _nhdp_address_pass1_tlvs, ARRAYSIZE(_nhdp_address_pass1_tlvs));
  rfc5444_reader_add_message_consumer(&_protocol->reader, &_nhdp_message_pass2_consumer, NULL, 0);
  rfc5444_reader_add_message_consumer(
    &_protocol->reader, &_nhdp_address_pass2_consumer, _nhdp_address_pass2_tlvs, ARRAYSIZE(_nhdp_address_pass2_tlvs));
}